

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitting.hpp
# Opt level: O1

pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *
eos::fitting::fit_shape_and_pose
          (pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *__return_storage_ptr__,
          MorphableModel *morphable_model,LandmarkCollection<Eigen::Vector2f> *landmarks,
          LandmarkMapper *landmark_mapper,int image_width,int image_height,
          EdgeTopology *edge_topology,ContourLandmarks *contour_landmarks,
          ModelContour *model_contour,int num_iterations,optional<int> num_shape_coefficients_to_fit
          ,float lambda_identity,optional<int> num_expression_coefficients_to_fit,
          optional<float> lambda_expressions,
          vector<float,_std::allocator<float>_> *pca_shape_coefficients,
          vector<float,_std::allocator<float>_> *expression_coefficients,
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          *fitted_image_points)

{
  optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
  *landmark_definitions;
  float *pfVar1;
  float *pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  _Optional_payload_base<int> _Var5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  pointer pMVar13;
  void *pvVar14;
  pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *ppVar15;
  pointer piVar16;
  pointer piVar17;
  pointer pMVar18;
  pointer pMVar19;
  uint uVar20;
  _Optional_payload_base<int> _Var21;
  Index IVar22;
  pointer pMVar23;
  pointer paVar24;
  pointer paVar25;
  Index size;
  pointer pLVar26;
  float *pfVar27;
  undefined8 *puVar28;
  runtime_error *this;
  ulong uVar29;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *filter;
  morphablemodel *pmVar30;
  float *pfVar31;
  int iVar32;
  _Storage<int,_true> _Var33;
  long lVar34;
  ulong uVar35;
  Index dstRows;
  bool bVar36;
  optional<int> vertex_idx;
  VectorXf current_combined_shape;
  VectorXf current_pca_shape;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  model_points;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  occluding_contour_landmarks;
  Mesh current_mesh;
  vector<int,_std::allocator<int>_> vertex_indices_contour;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  image_points_contour;
  ScaledOrthoProjectionParameters current_pose;
  pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
  edge_correspondences;
  VectorXf mean_plus_expressions;
  vector<int,_std::allocator<int>_> fixed_vertex_indices;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  fixed_image_points;
  RenderingParameters rendering_params;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho_1;
  Matrix<float,_3,_4,_0,_3,_4> affine_from_ortho;
  vector<int,_std::allocator<int>_> local_698;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_678;
  undefined1 local_658 [4];
  undefined4 uStack_654;
  undefined8 uStack_650;
  pointer pMStack_648;
  pointer pMStack_640;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  pointer local_628;
  _Optional_payload_base<float> _Stack_620;
  _Optional_payload_base<float> _Stack_618;
  pointer paStack_610;
  pointer paStack_608;
  pointer paStack_600;
  pointer local_5f8;
  pointer paStack_5f0;
  pointer paStack_5e8;
  pointer local_5e0;
  pointer paStack_5d8;
  pointer paStack_5d0;
  VectorXf local_5c8;
  uint local_5b4;
  _Optional_payload_base<int> local_5b0;
  LandmarkMapper *local_5a8;
  core *local_5a0;
  VectorXf local_598;
  ExpressionModel *local_588;
  int local_57c;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_578;
  undefined1 local_558 [8];
  undefined8 uStack_550;
  pointer local_548;
  Mesh local_540;
  ulong local_4b0;
  _Optional_payload_base<int> local_4a8;
  undefined4 local_49c;
  float local_498;
  float local_494;
  float local_490;
  float local_48c;
  vector<int,_std::allocator<int>_> local_488;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_468;
  pair<eos::core::Mesh,_eos::fitting::RenderingParameters> *local_448;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_440;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *local_438;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_430;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *local_428;
  VectorXf *local_420;
  Nested local_418;
  Nested pMStack_410;
  pointer local_408;
  pointer pMStack_400;
  float local_3f8;
  float local_3f4;
  float fStack_3f0;
  float local_3ec;
  float local_3e8;
  float fStack_3e4;
  pointer local_3e0;
  pointer local_3d8;
  pointer local_3d0;
  pointer local_3c8;
  pointer local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_3a8;
  _Optional_payload_base<int> local_3a0;
  void *local_398;
  long local_390;
  DenseStorage<float,__1,__1,_1,_0> local_388;
  vector<int,_std::allocator<int>_> local_378;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_360;
  vector<float,_std::allocator<float>_> local_348;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_330;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_318;
  vector<float,_std::allocator<float>_> local_300;
  undefined1 local_2e8 [16];
  float local_2d8;
  float local_2c8 [2];
  float afStack_2c0 [2];
  pointer local_2b8;
  _Optional_payload_base<float> _Stack_2b0;
  _Optional_payload_base<float> local_2a8;
  pointer paStack_2a0;
  string local_298;
  vector<float,_std::allocator<float>_> local_278;
  vector<float,_std::allocator<float>_> local_260;
  vector<float,_std::allocator<float>_> local_248;
  vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
  local_230;
  vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
  local_218;
  vector<float,_std::allocator<float>_> local_200;
  DenseStorage<float,__1,__1,_1,_0> local_1e8;
  Nested local_1d8;
  Nested pMStack_1d0;
  pointer local_1c8;
  pointer pMStack_1c0;
  float local_1b8;
  float local_1b4;
  float fStack_1b0;
  float local_1ac;
  Matrix4f local_1a8;
  Matrix<float,_3,_4,_0,_3,_4> local_168;
  Nested local_138;
  Nested pMStack_130;
  float local_128;
  float local_118 [2];
  float afStack_110 [2];
  pointer local_108;
  _Optional_payload_base<float> _Stack_100;
  _Optional_payload_base<float> local_f8;
  pointer paStack_f0;
  Matrix<float,_3,_4,_0,_3,_4> local_e8;
  Nested local_b8;
  Nested pMStack_b0;
  pointer local_a8;
  pointer pMStack_a0;
  float local_98;
  float local_94;
  float fStack_90;
  float local_8c;
  Nested local_88;
  Nested pMStack_80;
  float local_78;
  float local_68 [2];
  float afStack_60 [2];
  pointer local_58;
  _Optional_payload_base<float> _Stack_50;
  _Optional_payload_base<float> local_48;
  pointer paStack_40;
  
  local_5a8 = landmark_mapper;
  local_5a0 = (core *)landmarks;
  local_498 = lambda_identity;
  if ((ulong)(((long)(landmarks->
                     super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(landmarks->
                     super__Vector_base<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) < 4) {
    __assert_fail("landmarks.size() >= 4",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x104,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  if ((image_width < 1) || (image_height < 1)) {
    __assert_fail("image_width > 0 && image_height > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x105,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  local_448 = __return_storage_ptr__;
  if (num_iterations < 1) {
    __assert_fail("num_iterations > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x106,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  pfVar3 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pfVar4 = (pca_shape_coefficients->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  _Var5 = (_Optional_payload_base<int>)
          (morphable_model->shape_model).rescaled_pca_basis.
          super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>.m_storage.m_cols;
  _Var33 = _Var5._M_payload;
  if ((ulong)(long)_Var33._M_value < (ulong)((long)pfVar4 - (long)pfVar3 >> 2)) {
    __assert_fail("pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components()"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,0x107,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  uVar35 = (ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
                  super__Optional_payload_base<int> >> 0x20;
  if (_Var33._M_value <
      num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
      super__Optional_payload_base<int>._M_payload &&
      (~num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
        super__Optional_payload_base<int>._M_engaged & 1U) == 0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this,"Specified more shape coefficients to fit than the given shape model contains.")
    ;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar36 = (uVar35 & 1) != 0;
  if (bVar36) {
    _Var5 = (_Optional_payload_base<int>)
            num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int>;
  }
  uVar29 = 1;
  if (bVar36) {
    uVar29 = uVar35 & 0xff;
  }
  local_5b0 = (_Optional_payload_base<int>)morphable_model;
  if (pfVar3 == pfVar4) {
    if ((uVar29 & 1) == 0) {
      std::__throw_bad_optional_access();
    }
    std::vector<float,_std::allocator<float>_>::resize
              (pca_shape_coefficients,(long)_Var5._M_payload._M_value);
  }
  local_49c = (undefined4)uVar29;
  local_5b4 = image_height;
  local_4b0 = uVar35;
  std::vector<float,_std::allocator<float>_>::vector(&local_200,pca_shape_coefficients);
  morphablemodel::PcaModel::draw_sample
            ((PcaModel *)&local_598,(vector<float,_std::allocator<float>_> *)local_5b0);
  if (local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_200.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  _Var21 = local_5b0;
  if (*(char *)((long)local_5b0 + 0x140) == '\0') {
    __assert_fail("morphable_model.has_separate_expression_model()",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/fitting.hpp"
                  ,300,
                  "std::pair<core::Mesh, fitting::RenderingParameters> eos::fitting::fit_shape_and_pose(const morphablemodel::MorphableModel &, const core::LandmarkCollection<Eigen::Vector2f> &, const core::LandmarkMapper &, int, int, const morphablemodel::EdgeTopology &, const fitting::ContourLandmarks &, const fitting::ModelContour &, int, cpp17::optional<int>, float, cpp17::optional<int>, cpp17::optional<float>, std::vector<float> &, std::vector<float> &, std::vector<Eigen::Vector2f> &)"
                 );
  }
  if (*(char *)((long)local_5b0 + 0x140) == '\0') {
    std::__throw_bad_optional_access();
  }
  std::vector<float,_std::allocator<float>_>::vector(&local_300,expression_coefficients);
  local_588 = (ExpressionModel *)((long)_Var21 + 0xd0);
  morphablemodel::draw_sample((morphablemodel *)local_658,local_588,&local_300);
  local_540.vertices.
  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_598;
  local_540.vertices.
  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_658;
  if ((morphablemodel *)
      local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      uStack_650) {
    Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
              ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_5c8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                *)&local_540);
    _Var21 = local_5b0;
    local_57c = image_width;
    free((void *)_local_658);
    if (local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_300.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_420 = (VectorXf *)((long)_Var21 + 0x68);
    local_428 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                ((long)_Var21 + 0x50);
    local_430 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                ((long)_Var21 + 0xb8);
    local_438 = (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                ((long)_Var21 + 0x188);
    local_440 = (vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> *)
                ((long)_Var21 + 0x1a0);
    local_4a8 = (_Optional_payload_base<int>)((ulong)_Var5 & 0xffffffff);
    morphablemodel::sample_to_mesh
              (&local_540,&local_5c8,local_420,local_428,local_430,local_438,local_440);
    local_578.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
    local_578.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
    local_578.
    super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (Matrix<float,_4,_1,_0,_4,_1> *)0x0;
    local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_678.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_678.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_678.
    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pLVar26 = *(pointer *)local_5a0;
    if (*(pointer *)(local_5a0 + 8) != pLVar26) {
      landmark_definitions =
           (optional<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
            *)((long)local_5b0 + 0x148);
      lVar34 = 0x20;
      uVar35 = 0;
      do {
        lVar6 = *(long *)((long)(&pLVar26->coordinates + -8) + lVar34);
        local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_298,lVar6,
                   *(long *)((long)(&pLVar26->coordinates + -7) + lVar34) + lVar6);
        _local_658 = (_Optional_payload_base<int>)
                     core::get_vertex_index(&local_298,local_5a8,landmark_definitions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_298._M_dataplus._M_p != &local_298.field_2) {
          operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
        }
        if (uStack_654._0_1_ != false) {
          local_2e8._0_8_ =
               (long)(int)local_658 * 0xc +
               (long)local_540.vertices.
                     super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          std::vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
          ::emplace_back<Eigen::Homogeneous<Eigen::Matrix<float,3,1,0,3,1>,0>>
                    ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                      *)&local_578,(Homogeneous<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0> *)local_2e8)
          ;
          if (uStack_654._0_1_ == false) {
            std::__throw_bad_optional_access();
          }
          if (local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_698,
                       (iterator)
                       local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)local_658);
          }
          else {
            *local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = (int)local_658;
            local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
          ::emplace_back<Eigen::Matrix<float,2,1,0,2,1>const&>
                    ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                      *)&local_678,(Matrix<float,_2,_1,_0,_2,_1> *)(*(long *)local_5a0 + lVar34));
        }
        uVar35 = uVar35 + 1;
        pLVar26 = *(pointer *)local_5a0;
        uVar29 = ((long)*(pointer *)(local_5a0 + 8) - (long)pLVar26 >> 3) * -0x3333333333333333;
        lVar34 = lVar34 + 0x28;
      } while (uVar35 <= uVar29 && uVar29 - uVar35 != 0);
    }
    std::
    vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
    ::vector(&local_318,&local_678);
    std::
    vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
    ::vector(&local_330,&local_578);
    iVar32 = local_57c;
    _Var5 = local_5b0;
    uVar20 = local_5b4;
    local_3a0 = (_Optional_payload_base<int>)((ulong)local_5b4 | 0x100000000);
    estimate_orthographic_projection_linear
              ((ScaledOrthoProjectionParameters *)&local_418,&local_318,&local_330,true,
               (optional<int>)local_3a0);
    _Var21 = local_4a8;
    if (local_330.
        super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_330.
                      super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_330.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_330.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_318.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_318.
                      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_318.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    local_b8 = local_418;
    pMStack_b0 = pMStack_410;
    local_a8 = local_408;
    pMStack_a0 = pMStack_400;
    local_98 = local_3f8;
    local_94 = local_3f4;
    fStack_90 = fStack_3f0;
    local_8c = local_3ec;
    RenderingParameters::RenderingParameters
              ((RenderingParameters *)local_2e8,(ScaledOrthoProjectionParameters *)&local_b8,iVar32,
               uVar20);
    local_88 = (Nested)local_2e8._0_8_;
    pMStack_80 = (Nested)local_2e8._8_8_;
    local_78 = local_2d8;
    local_68[0] = local_2c8[0];
    local_68[1] = local_2c8[1];
    afStack_60[0] = afStack_2c0[0];
    afStack_60[1] = afStack_2c0[1];
    local_58 = local_2b8;
    _Stack_50 = _Stack_2b0;
    local_48 = local_2a8;
    paStack_40 = paStack_2a0;
    get_3x4_affine_camera_matrix(&local_e8,(RenderingParameters *)&local_88,iVar32,uVar20);
    if (*(char *)((long)_Var5 + 0x140) == '\0') {
      std::__throw_bad_optional_access();
    }
    fit_expressions((vector<float,_std::allocator<float>_> *)local_658,local_588,&local_598,
                    &local_e8,&local_678,&local_698,lambda_expressions,
                    num_expression_coefficients_to_fit);
    std::vector<float,_std::allocator<float>_>::_M_move_assign(expression_coefficients,local_658);
    if (_local_658 != (_Optional_payload_base<int>)0x0) {
      operator_delete((void *)_local_658,(long)pMStack_648 - (long)_local_658);
    }
    if (*(char *)((long)_Var5 + 0x140) == '\0') {
      std::__throw_bad_optional_access();
    }
    std::vector<float,_std::allocator<float>_>::vector(&local_348,expression_coefficients);
    morphablemodel::draw_sample((morphablemodel *)local_658,local_588,&local_348);
    pfVar31 = local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_data;
    pmVar30 = uStack_650;
    _Var5 = _local_658;
    if ((morphablemodel *)
        local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
        uStack_650) {
      if ((morphablemodel *)
          local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != uStack_650) {
        if ((long)uStack_650 < 0) {
LAB_0015a43c:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/PlainObjectBase.h"
                        ,0x115,
                        "void Eigen::PlainObjectBase<Eigen::Matrix<float, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<float, -1, 1>]"
                       );
        }
        free(local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
             m_data);
        if (pmVar30 == (morphablemodel *)0x0) {
          pfVar27 = (float *)0x0;
        }
        else {
          if ((morphablemodel *)0x3fffffffffffffff < pmVar30) {
LAB_00158e56:
            puVar28 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar28 = boost::program_options::detail::cmdline::cmdline;
            __cxa_throw(puVar28,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pfVar27 = (float *)malloc((long)pmVar30 * 4);
          if ((morphablemodel *)0x3 < pmVar30 && ((ulong)pfVar27 & 0xf) != 0) {
LAB_0015a45b:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/util/Memory.h"
                          ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pfVar27 == (float *)0x0) goto LAB_00158e56;
        }
        local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)pmVar30;
        local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             pfVar27;
      }
      uVar20 = local_5b4;
      if ((morphablemodel *)
          local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
          != pmVar30) {
LAB_0015a3e0:
        __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                      "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/AssignEvaluator.h"
                      ,0x2fd,
                      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<float, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Matrix<float, -1, 1>>, T1 = float, T2 = float]"
                     );
      }
      pmVar30 = (morphablemodel *)
                (local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows + 3);
      if (-1 < local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_rows) {
        pmVar30 = (morphablemodel *)
                  local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                  m_rows;
      }
      pmVar30 = (morphablemodel *)((ulong)pmVar30 & 0xfffffffffffffffc);
      if (3 < local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
              m_rows) {
        lVar34 = 0;
        do {
          pfVar27 = (float *)((long)pfVar31 + lVar34 * 4);
          fVar7 = pfVar27[1];
          fVar8 = pfVar27[2];
          fVar9 = pfVar27[3];
          pfVar1 = (float *)((long)_Var5 + lVar34 * 4);
          fVar10 = pfVar1[1];
          fVar11 = pfVar1[2];
          fVar12 = pfVar1[3];
          pfVar2 = local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                   .m_data + lVar34;
          *pfVar2 = *pfVar27 + *pfVar1;
          pfVar2[1] = fVar7 + fVar10;
          pfVar2[2] = fVar8 + fVar11;
          pfVar2[3] = fVar9 + fVar12;
          lVar34 = lVar34 + 4;
        } while (lVar34 < (long)pmVar30);
      }
      if ((long)pmVar30 <
          local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
      {
        do {
          local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
          [(long)pmVar30] =
               *(float *)((long)pfVar31 + (long)pmVar30 * 4) +
               *(float *)((long)_Var5 + (long)pmVar30 * 4);
          pmVar30 = pmVar30 + 1;
        } while ((morphablemodel *)
                 local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows != pmVar30);
      }
      free((void *)_local_658);
      if (local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_348.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      morphablemodel::sample_to_mesh
                ((Mesh *)local_658,&local_5c8,local_420,local_428,local_430,local_438,local_440);
      pMVar23 = local_540.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar13 = local_540.vertices.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_540.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_658;
      local_540.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_650;
      local_540.vertices.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMStack_648;
      _local_658 = (_Optional_payload_base<int>)0x0;
      uStack_650 = (morphablemodel *)0x0;
      pMStack_648 = (pointer)0x0;
      if ((_Optional_payload_base<int>)pMVar13 != (_Optional_payload_base<int>)0x0) {
        operator_delete(pMVar13,(long)pMVar23 - (long)pMVar13);
      }
      pMVar23 = local_540.colors.
                super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_540.colors.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = pMStack_640;
      local_540.colors.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_634,fStack_638);
      pMVar13 = (pointer)CONCAT44(fStack_62c,fStack_630);
      pMStack_640 = (pointer)0x0;
      fStack_638 = 0.0;
      fStack_634 = 0.0;
      fStack_630 = 0.0;
      fStack_62c = 0.0;
      if (pMVar23 != (pointer)0x0) {
        uVar35 = (long)local_540.colors.
                       super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar23;
        local_540.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar13;
        operator_delete(pMVar23,uVar35);
        pMVar13 = local_540.colors.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      }
      local_540.colors.
      super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar13;
      pMVar19 = local_540.texcoords.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pMVar18 = local_540.texcoords.
                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_540.texcoords.
      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_628;
      local_540.texcoords.
      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_620;
      local_540.texcoords.
      super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Stack_618;
      local_628 = (pointer)0x0;
      _Stack_620._M_payload = (_Storage<float,_true>)0x0;
      _Stack_620._M_engaged = false;
      _Stack_620._5_3_ = 0;
      _Stack_618._M_payload = (_Storage<float,_true>)0x0;
      _Stack_618._M_engaged = false;
      _Stack_618._5_3_ = 0;
      if (pMVar18 != (pointer)0x0) {
        operator_delete(pMVar18,(long)pMVar19 - (long)pMVar18);
      }
      paVar25 = local_540.tvi.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      paVar24 = local_540.tvi.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_540.tvi.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = paStack_610;
      local_540.tvi.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = paStack_608;
      local_540.tvi.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = paStack_600;
      paStack_610 = (pointer)0x0;
      paStack_608 = (pointer)0x0;
      paStack_600 = (pointer)0x0;
      if (paVar24 != (pointer)0x0) {
        operator_delete(paVar24,(long)paVar25 - (long)paVar24);
      }
      paVar25 = local_540.tci.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      paVar24 = local_540.tci.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_540.tci.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_5f8;
      local_540.tci.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = paStack_5f0;
      local_540.tci.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = paStack_5e8;
      local_5f8 = (pointer)0x0;
      paStack_5f0 = (pointer)0x0;
      paStack_5e8 = (pointer)0x0;
      if (paVar24 != (pointer)0x0) {
        operator_delete(paVar24,(long)paVar25 - (long)paVar24);
      }
      paVar25 = local_540.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
      paVar24 = local_540.tti.
                super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_540.tti.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_5e0;
      local_540.tti.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = paStack_5d8;
      local_540.tti.super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = paStack_5d0;
      local_5e0 = (pointer)0x0;
      paStack_5d8 = (pointer)0x0;
      paStack_5d0 = (pointer)0x0;
      if (paVar24 != (pointer)0x0) {
        operator_delete(paVar24,(long)paVar25 - (long)paVar24);
      }
      if (local_5e0 != (pointer)0x0) {
        operator_delete(local_5e0,(long)paStack_5d0 - (long)local_5e0);
      }
      if (local_5f8 != (pointer)0x0) {
        operator_delete(local_5f8,(long)paStack_5e8 - (long)local_5f8);
      }
      if (paStack_610 != (pointer)0x0) {
        operator_delete(paStack_610,(long)paStack_600 - (long)paStack_610);
      }
      if (local_628 != (pointer)0x0) {
        operator_delete(local_628,(long)_Stack_618 - (long)local_628);
      }
      if (pMStack_640 != (pointer)0x0) {
        operator_delete(pMStack_640,CONCAT44(fStack_62c,fStack_630) - (long)pMStack_640);
      }
      if (_local_658 != (_Optional_payload_base<int>)0x0) {
        operator_delete((void *)_local_658,(long)pMStack_648 - (long)_local_658);
      }
      std::
      vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
      ::vector(&local_360,&local_678);
      std::vector<int,_std::allocator<int>_>::vector(&local_378,&local_698);
      local_48c = (float)(int)uVar20;
      local_490 = (float)iVar32;
      local_494 = (float)(int)-uVar20;
      local_3a8 = &contour_landmarks->left_contour;
      uVar35 = (ulong)num_shape_coefficients_to_fit.super__Optional_base<int,_true,_true>._M_payload
                      .super__Optional_payload_base<int> & 0xffffff0000000000;
      if ((local_4b0 & 1) == 0) {
        uVar35 = 0;
      }
      local_4a8 = (_Optional_payload_base<int>)
                  ((ulong)_Var21 & 0xffffffff | (ulong)(byte)local_49c << 0x20 | uVar35);
      if (num_iterations < 2) {
        num_iterations = 1;
      }
      local_4b0 = CONCAT44(local_4b0._4_4_,num_iterations);
      iVar32 = 0;
      while( true ) {
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::operator=(&local_678,&local_360);
        std::vector<int,_std::allocator<int>_>::operator=(&local_698,&local_378);
        local_468.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_468.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_468.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        RenderingParameters::get_yaw_pitch_roll((RenderingParameters *)local_658);
        local_5a8 = (LandmarkMapper *)CONCAT44(local_5a8._4_4_,local_658);
        RenderingParameters::get_modelview((Matrix4f *)&local_3e8,(RenderingParameters *)local_2e8);
        RenderingParameters::get_projection(&local_1a8,(RenderingParameters *)local_2e8);
        local_558 = (undefined1  [8])((ulong)(uint)local_48c << 0x20);
        uStack_550 = (pointer)CONCAT44(local_494,local_490);
        get_contour_correspondences
                  ((tuple<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)local_658,(LandmarkCollection<Eigen::Vector2f> *)local_5a0,contour_landmarks,
                   model_contour,local_5a8._0_4_,&local_540,(Matrix4f *)&local_3e8,&local_1a8,
                   (Vector4f *)local_558,7.5);
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::_M_move_assign(&local_468,&local_628);
        std::vector<int,_std::allocator<int>_>::_M_move_assign(&local_488,(Mesh *)local_658);
        if (local_628 != (pointer)0x0) {
          operator_delete(local_628,(long)_Stack_618 - (long)local_628);
        }
        if (pMStack_640 != (pointer)0x0) {
          operator_delete(pMStack_640,CONCAT44(fStack_62c,fStack_630) - (long)pMStack_640);
        }
        if (_local_658 != (_Optional_payload_base<int>)0x0) {
          operator_delete((void *)_local_658,(long)pMStack_648 - (long)_local_658);
        }
        _local_658 = (_Optional_payload_base<int>)0x0;
        uStack_650 = (morphablemodel *)0x0;
        pMStack_648 = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)local_658,
                   ((long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) +
                   ((long)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)local_658,uStack_650,
                   local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)local_658,uStack_650,
                   local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        piVar17 = local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        piVar16 = local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)_local_658;
        local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)uStack_650;
        local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)pMStack_648;
        if ((Nested)piVar16 != (Nested)0x0) {
          operator_delete(piVar16,(long)piVar17 - (long)piVar16);
        }
        _local_658 = (_Optional_payload_base<int>)0x0;
        uStack_650 = (morphablemodel *)0x0;
        pMStack_648 = (pointer)0x0;
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::reserve((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)local_658,
                  ((long)local_468.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_468.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) +
                  ((long)local_678.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_678.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)local_658,uStack_650,
                   local_678.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_678.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        filter = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_468.
                    super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)local_658,uStack_650,
                   local_468.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        pMVar19 = local_678.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar18 = local_678.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_678.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_658;
        local_678.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_650;
        local_678.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMStack_648;
        if ((pointer)pMVar18 != (pointer)0x0) {
          operator_delete(pMVar18,(long)pMVar19 - (long)pMVar18);
        }
        local_558 = (undefined1  [8])0x0;
        uStack_550 = (pointer)0x0;
        local_548 = (pointer)0x0;
        if (0.0 <= local_5a8._0_4_) {
          core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                    ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)local_658,local_5a0,
                     (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)local_3a8,filter);
          pMVar13 = (pointer)uStack_650;
          for (pfVar31 = (float *)_local_658; (pointer)pfVar31 != pMVar13; pfVar31 = pfVar31 + 10) {
            local_3e8 = pfVar31[8];
            fStack_3e4 = pfVar31[9];
            std::
            vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
            emplace_back<Eigen::Matrix<float,2,1,0,2,1>>
                      ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                        *)local_558,(Matrix<float,_2,_1,_0,_2,_1> *)&local_3e8);
          }
        }
        else {
          core::filter<Eigen::Matrix<float,2,1,0,2,1>>
                    ((LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)local_658,local_5a0,
                     (LandmarkCollection<Eigen::Matrix<float,_2,_1>_> *)contour_landmarks,filter);
          pMVar13 = (pointer)uStack_650;
          for (pfVar31 = (float *)_local_658; (pointer)pfVar31 != pMVar13; pfVar31 = pfVar31 + 10) {
            local_3e8 = pfVar31[8];
            fStack_3e4 = pfVar31[9];
            std::
            vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
            emplace_back<Eigen::Matrix<float,2,1,0,2,1>>
                      ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                        *)local_558,(Matrix<float,_2,_1,_0,_2,_1> *)&local_3e8);
          }
        }
        std::
        vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
        ::~vector((vector<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>,_std::allocator<eos::core::Landmark<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>_>
                   *)local_658);
        find_occluding_edge_correspondences
                  ((pair<std::vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>,_std::vector<int,_std::allocator<int>_>_>
                    *)&local_3e8,&local_540,edge_topology,(RenderingParameters *)local_2e8,
                   (vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                    *)local_558,180.0,true);
        _local_658 = (_Optional_payload_base<int>)0x0;
        uStack_650 = (morphablemodel *)0x0;
        pMStack_648 = (pointer)0x0;
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::reserve((vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   *)local_658,
                  ((long)local_3e0 - CONCAT44(fStack_3e4,local_3e8) >> 3) +
                  ((long)local_678.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_678.
                         super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3));
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)local_658,uStack_650,
                   local_678.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   local_678.
                   super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<Eigen::Matrix<float,2,1,0,2,1>const*,std::vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>>>
                  ((vector<Eigen::Matrix<float,2,1,0,2,1>,std::allocator<Eigen::Matrix<float,2,1,0,2,1>>>
                    *)local_658,uStack_650,CONCAT44(fStack_3e4,local_3e8),local_3e0);
        pMVar19 = local_678.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar18 = local_678.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_678.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_658;
        local_678.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_650;
        local_678.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pMStack_648;
        if (pMVar18 != (pointer)0x0) {
          operator_delete(pMVar18,(long)pMVar19 - (long)pMVar18);
        }
        _local_658 = (_Optional_payload_base<int>)0x0;
        uStack_650 = (morphablemodel *)0x0;
        pMStack_648 = (pointer)0x0;
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)local_658,
                   ((long)local_3c8 - (long)local_3d0 >> 2) +
                   ((long)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2));
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)local_658,uStack_650,
                   local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::vector<int,std::allocator<int>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
                  ((vector<int,std::allocator<int>> *)local_658,uStack_650,local_3d0,local_3c8);
        piVar17 = local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
        piVar16 = local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)_local_658;
        local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)uStack_650;
        local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)pMStack_648;
        if ((pointer)piVar16 != (pointer)0x0) {
          operator_delete(piVar16,(long)piVar17 - (long)piVar16);
        }
        piVar16 = local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        pfVar31 = (float *)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
        if (local_578.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            local_578.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_578.
          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_578.
               super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
        }
        for (; pfVar31 != (float *)piVar16; pfVar31 = pfVar31 + 1) {
          lVar34 = (long)(int)*pfVar31;
          _local_658 = (_Optional_payload_base<int>)
                       CONCAT44(*(undefined4 *)
                                 ((undefined1 *)
                                  ((long)local_540.vertices.
                                         super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start + 4) +
                                 lVar34 * 0xc),
                                *(undefined4 *)
                                 ((long)local_540.vertices.
                                        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar34 * 0xc));
          uStack_650 = (morphablemodel *)
                       CONCAT44(0x3f800000,
                                *(undefined4 *)
                                 ((long)((long)local_540.vertices.
                                               super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start + 8) +
                                 lVar34 * 0xc));
          if (local_578.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              local_578.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::
            vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>::
            _M_realloc_insert<Eigen::Matrix<float,4,1,0,4,1>>
                      ((vector<Eigen::Matrix<float,4,1,0,4,1>,std::allocator<Eigen::Matrix<float,4,1,0,4,1>>>
                        *)&local_578,
                       (iterator)
                       local_578.
                       super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       (Matrix<float,_4,_1,_0,_4,_1> *)local_658);
          }
          else {
            *(_Optional_payload_base<int> *)
             ((local_578.
               super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
             super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array =
                 _local_658;
            *(morphablemodel **)
             (((local_578.
                super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
              super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>).m_storage.m_data.array +
             2) = uStack_650;
            local_578.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_578.
                 super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        std::
        vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ::vector(&local_218,&local_678);
        std::
        vector<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
        ::vector(&local_230,&local_578);
        _Var5 = local_5b0;
        estimate_orthographic_projection_linear
                  ((ScaledOrthoProjectionParameters *)local_658,&local_218,&local_230,true,
                   (optional<int>)local_3a0);
        local_3f8 = fStack_638;
        local_408 = pMStack_648;
        pMStack_400 = pMStack_640;
        local_418 = (Nested)_local_658;
        pMStack_410 = (Nested)uStack_650;
        local_3ec = fStack_62c;
        fStack_3f0 = fStack_630;
        local_3f4 = fStack_634;
        if (local_230.
            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_230.
                          super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_230.
                                super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_230.
                                super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        local_5a8 = (LandmarkMapper *)CONCAT44(local_5a8._4_4_,iVar32);
        if (local_218.
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_218.
                          super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_218.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_218.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar32 = local_57c;
        uVar20 = local_5b4;
        local_1b8 = local_3f8;
        local_1c8 = local_408;
        pMStack_1c0 = pMStack_400;
        local_1d8 = local_418;
        pMStack_1d0 = pMStack_410;
        local_1ac = local_3ec;
        local_1b4 = local_3f4;
        fStack_1b0 = fStack_3f0;
        RenderingParameters::RenderingParameters
                  ((RenderingParameters *)local_658,(ScaledOrthoProjectionParameters *)&local_1d8,
                   local_57c,local_5b4);
        local_2d8 = pMStack_648._0_4_;
        local_2e8._0_8_ = _local_658;
        local_2e8._8_8_ = uStack_650;
        local_2c8[1] = fStack_634;
        local_2c8[0] = fStack_638;
        afStack_2c0[1] = fStack_62c;
        afStack_2c0[0] = fStack_630;
        local_2a8 = _Stack_618;
        paStack_2a0 = paStack_610;
        local_2b8 = local_628;
        _Stack_2b0 = _Stack_620;
        local_128 = pMStack_648._0_4_;
        local_138 = (Nested)_local_658;
        pMStack_130 = (Nested)uStack_650;
        local_f8 = _Stack_618;
        paStack_f0 = paStack_610;
        local_108 = local_628;
        _Stack_100 = _Stack_620;
        local_118 = local_2c8;
        afStack_110 = afStack_2c0;
        get_3x4_affine_camera_matrix
                  ((Matrix<float,_3,_4,_0,_3,_4> *)&local_1a8,(RenderingParameters *)&local_138,
                   iVar32,uVar20);
        if (*(char *)((long)_Var5 + 0x140) == '\0') {
          std::__throw_bad_optional_access();
        }
        std::vector<float,_std::allocator<float>_>::vector(&local_248,expression_coefficients);
        morphablemodel::draw_sample((morphablemodel *)&local_398,local_588,&local_248);
        _local_658 = _Var5;
        uStack_650 = (morphablemodel *)&local_398;
        if (*(long *)((long)_Var5 + 8) != local_390) break;
        Eigen::PlainObjectBase<Eigen::Matrix<float,-1,1,0,-1,1>>::
        PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,float>,Eigen::Matrix<float,_1,1,0,_1,1>const,Eigen::Matrix<float,_1,1,0,_1,1>const>>
                  ((PlainObjectBase<Eigen::Matrix<float,_1,1,0,_1,1>> *)&local_388,
                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float,_float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>_>
                    *)local_658);
        free(local_398);
        if (local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [0] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[0];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [1] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[1];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [2] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[2];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [3] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[3];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [4] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[4];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [5] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[5];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [6] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[6];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [7] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[7];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [8] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[8];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [9] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data
              .array[9];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [10] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
               m_data.array[10];
        local_168.super_PlainObjectBase<Eigen::Matrix<float,_3,_4,_0,_3,_4>_>.m_storage.m_data.array
        [0xb] = local_1a8.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.
                m_data.array[0xb];
        Eigen::DenseStorage<float,_-1,_-1,_1,_0>::DenseStorage(&local_1e8,&local_388);
        fit_shape_to_landmarks_linear
                  ((vector<float,_std::allocator<float>_> *)local_658,(PcaModel *)_Var5,&local_168,
                   &local_678,&local_698,(VectorXf *)&local_1e8,local_498,(optional<int>)local_4a8,
                   (optional<float>)0x0,(optional<float>)0x0);
        std::vector<float,_std::allocator<float>_>::_M_move_assign
                  (pca_shape_coefficients,(Mesh *)local_658);
        if (_local_658 != (_Optional_payload_base<int>)0x0) {
          operator_delete((void *)_local_658,(long)pMStack_648 - (long)_local_658);
        }
        free(local_1e8.m_data);
        std::vector<float,_std::allocator<float>_>::vector(&local_260,pca_shape_coefficients);
        morphablemodel::PcaModel::draw_sample
                  ((PcaModel *)local_658,(vector<float,_std::allocator<float>_> *)_Var5);
        IVar22 = local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows;
        pfVar31 = local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
             (float *)_local_658;
        local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
             (Index)uStack_650;
        _local_658 = (_Optional_payload_base<int>)pfVar31;
        uStack_650 = (morphablemodel *)IVar22;
        free(pfVar31);
        if (local_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_260.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (*(char *)((long)_Var5 + 0x140) == '\0') {
          std::__throw_bad_optional_access();
        }
        fit_expressions((vector<float,_std::allocator<float>_> *)local_658,local_588,&local_598,
                        (Matrix<float,_3,_4,_0,_3,_4> *)&local_1a8,&local_678,&local_698,
                        lambda_expressions,num_expression_coefficients_to_fit);
        std::vector<float,_std::allocator<float>_>::_M_move_assign
                  (expression_coefficients,(Mesh *)local_658);
        if (_local_658 != (_Optional_payload_base<int>)0x0) {
          operator_delete((void *)_local_658,(long)pMStack_648 - (long)_local_658);
        }
        if (*(char *)((long)_Var5 + 0x140) == '\0') {
          std::__throw_bad_optional_access();
        }
        std::vector<float,_std::allocator<float>_>::vector(&local_278,expression_coefficients);
        morphablemodel::draw_sample((morphablemodel *)local_658,local_588,&local_278);
        pfVar31 = local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                  m_data;
        pmVar30 = uStack_650;
        _Var5 = _local_658;
        if ((morphablemodel *)
            local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != uStack_650) break;
        if ((morphablemodel *)
            local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != uStack_650) {
          if ((long)uStack_650 < 0) goto LAB_0015a43c;
          free(local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          if (pmVar30 == (morphablemodel *)0x0) {
            pfVar27 = (float *)0x0;
          }
          else {
            if ((morphablemodel *)0x3fffffffffffffff < pmVar30) {
LAB_0015a40e:
              puVar28 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar28 = boost::program_options::detail::cmdline::cmdline;
              __cxa_throw(puVar28,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
            }
            pfVar27 = (float *)malloc((long)pmVar30 * 4);
            if ((morphablemodel *)0x3 < pmVar30 && ((ulong)pfVar27 & 0xf) != 0) goto LAB_0015a45b;
            if (pfVar27 == (float *)0x0) goto LAB_0015a40e;
          }
          local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
               (Index)pmVar30;
          local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data =
               pfVar27;
        }
        if ((morphablemodel *)
            local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
            != pmVar30) goto LAB_0015a3e0;
        pmVar30 = (morphablemodel *)
                  (local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                   .m_rows + 3);
        if (-1 < local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                 m_rows) {
          pmVar30 = (morphablemodel *)
                    local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                    m_storage.m_rows;
        }
        pmVar30 = (morphablemodel *)((ulong)pmVar30 & 0xfffffffffffffffc);
        if (3 < local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
                m_rows) {
          lVar34 = 0;
          do {
            pfVar27 = (float *)((long)pfVar31 + lVar34 * 4);
            fVar7 = pfVar27[1];
            fVar8 = pfVar27[2];
            fVar9 = pfVar27[3];
            pfVar1 = (float *)((long)_Var5 + lVar34 * 4);
            fVar10 = pfVar1[1];
            fVar11 = pfVar1[2];
            fVar12 = pfVar1[3];
            pfVar2 = local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data + lVar34;
            *pfVar2 = *pfVar27 + *pfVar1;
            pfVar2[1] = fVar7 + fVar10;
            pfVar2[2] = fVar8 + fVar11;
            pfVar2[3] = fVar9 + fVar12;
            lVar34 = lVar34 + 4;
          } while (lVar34 < (long)pmVar30);
        }
        if ((long)pmVar30 <
            local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_rows
           ) {
          do {
            local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.m_data
            [(long)pmVar30] =
                 *(float *)((long)pfVar31 + (long)pmVar30 * 4) +
                 *(float *)((long)_Var5 + (long)pmVar30 * 4);
            pmVar30 = pmVar30 + 1;
          } while ((morphablemodel *)
                   local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage
                   .m_rows != pmVar30);
        }
        free((void *)_local_658);
        if (local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_278.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        morphablemodel::sample_to_mesh
                  ((Mesh *)local_658,&local_5c8,local_420,local_428,local_430,local_438,local_440);
        pMVar23 = local_540.vertices.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar13 = local_540.vertices.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        iVar32 = (int)local_5a8._0_4_;
        local_540.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)_local_658;
        local_540.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)uStack_650;
        local_540.vertices.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pMStack_648;
        _local_658 = (_Optional_payload_base<int>)0x0;
        uStack_650 = (morphablemodel *)0x0;
        pMStack_648 = (pointer)0x0;
        if ((_Optional_payload_base<int>)pMVar13 != (_Optional_payload_base<int>)0x0) {
          operator_delete(pMVar13,(long)pMVar23 - (long)pMVar13);
        }
        pMVar23 = local_540.colors.
                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_540.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pMStack_640;
        local_540.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(fStack_634,fStack_638);
        pMVar13 = (pointer)CONCAT44(fStack_62c,fStack_630);
        pMStack_640 = (pointer)0x0;
        fStack_638 = 0.0;
        fStack_634 = 0.0;
        fStack_630 = 0.0;
        fStack_62c = 0.0;
        if (pMVar23 != (pointer)0x0) {
          uVar35 = (long)local_540.colors.
                         super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pMVar23;
          local_540.colors.
          super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar13;
          operator_delete(pMVar23,uVar35);
          pMVar13 = local_540.colors.
                    super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
        }
        local_540.colors.
        super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pMVar13;
        pMVar19 = local_540.texcoords.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        pMVar18 = local_540.texcoords.
                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_540.texcoords.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_start = local_628;
        local_540.texcoords.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)_Stack_620;
        local_540.texcoords.
        super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)_Stack_618;
        local_628 = (pointer)0x0;
        _Stack_620._M_payload = (_Storage<float,_true>)0x0;
        _Stack_620._M_engaged = false;
        _Stack_620._5_3_ = 0;
        _Stack_618._M_payload = (_Storage<float,_true>)0x0;
        _Stack_618._M_engaged = false;
        _Stack_618._5_3_ = 0;
        if (pMVar18 != (pointer)0x0) {
          operator_delete(pMVar18,(long)pMVar19 - (long)pMVar18);
        }
        paVar25 = local_540.tvi.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar24 = local_540.tvi.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_540.tvi.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = paStack_610;
        local_540.tvi.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paStack_608;
        local_540.tvi.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = paStack_600;
        paStack_610 = (pointer)0x0;
        paStack_608 = (pointer)0x0;
        paStack_600 = (pointer)0x0;
        if (paVar24 != (pointer)0x0) {
          operator_delete(paVar24,(long)paVar25 - (long)paVar24);
        }
        paVar25 = local_540.tci.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar24 = local_540.tci.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_540.tci.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = local_5f8;
        local_540.tci.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paStack_5f0;
        local_540.tci.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = paStack_5e8;
        local_5f8 = (pointer)0x0;
        paStack_5f0 = (pointer)0x0;
        paStack_5e8 = (pointer)0x0;
        if (paVar24 != (pointer)0x0) {
          operator_delete(paVar24,(long)paVar25 - (long)paVar24);
        }
        paVar25 = local_540.tti.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
        paVar24 = local_540.tti.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_540.tti.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_start = local_5e0;
        local_540.tti.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish = paStack_5d8;
        local_540.tti.
        super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = paStack_5d0;
        local_5e0 = (pointer)0x0;
        paStack_5d8 = (pointer)0x0;
        paStack_5d0 = (pointer)0x0;
        if (paVar24 != (pointer)0x0) {
          operator_delete(paVar24,(long)paVar25 - (long)paVar24);
        }
        if (local_5e0 != (pointer)0x0) {
          operator_delete(local_5e0,(long)paStack_5d0 - (long)local_5e0);
        }
        if (local_5f8 != (pointer)0x0) {
          operator_delete(local_5f8,(long)paStack_5e8 - (long)local_5f8);
        }
        if (paStack_610 != (pointer)0x0) {
          operator_delete(paStack_610,(long)paStack_600 - (long)paStack_610);
        }
        if (local_628 != (pointer)0x0) {
          operator_delete(local_628,(long)_Stack_618 - (long)local_628);
        }
        if (pMStack_640 != (pointer)0x0) {
          operator_delete(pMStack_640,CONCAT44(fStack_62c,fStack_630) - (long)pMStack_640);
        }
        if (_local_658 != (_Optional_payload_base<int>)0x0) {
          operator_delete((void *)_local_658,(long)pMStack_648 - (long)_local_658);
        }
        free(local_388.m_data);
        if (local_3d0 != (pointer)0x0) {
          operator_delete(local_3d0,(long)local_3c0 - (long)local_3d0);
        }
        pvVar14 = (void *)CONCAT44(fStack_3e4,local_3e8);
        if (pvVar14 != (void *)0x0) {
          operator_delete(pvVar14,(long)local_3d8 - (long)pvVar14);
        }
        if (local_558 != (undefined1  [8])0x0) {
          operator_delete((void *)local_558,(long)local_548 - (long)local_558);
        }
        if (local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_488.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if (local_468.
            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_468.
                          super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_468.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_468.
                                super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        iVar32 = iVar32 + 1;
        if (iVar32 == (int)local_4b0) {
          std::
          vector<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
          ::operator=(fitted_image_points,&local_678);
          ppVar15 = local_448;
          core::Mesh::Mesh(&local_448->first,&local_540);
          (ppVar15->second).frustum.t = local_2d8;
          (ppVar15->second).camera_type = local_2e8._0_4_;
          (ppVar15->second).frustum.l = (float)local_2e8._4_4_;
          (ppVar15->second).frustum.r = (float)local_2e8._8_4_;
          (ppVar15->second).frustum.b = (float)local_2e8._12_4_;
          *(float (*) [2])
           (ppVar15->second).rotation.m_coeffs.
           super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array =
               local_2c8;
          *(float (*) [2])
           ((long)(ppVar15->second).rotation.m_coeffs.
                  super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
           + 8) = afStack_2c0;
          (ppVar15->second).fov_y.super__Optional_base<float,_true,_true>._M_payload.
          super__Optional_payload_base<float> = local_2a8;
          *(pointer *)&(ppVar15->second).screen_width = paStack_2a0;
          *(pointer *)&(ppVar15->second).t_x = local_2b8;
          (ppVar15->second).t_z.super__Optional_base<float,_true,_true>._M_payload.
          super__Optional_payload_base<float> = _Stack_2b0;
          if (local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_378.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_360.
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_360.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_360.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_360.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((pointer)local_678.
                       super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_678.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_678.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_678.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((Nested)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start != (Nested)0x0) {
            operator_delete(local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_698.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
          }
          if (local_578.
              super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (Matrix<float,_4,_1,_0,_4,_1> *)0x0) {
            operator_delete(local_578.
                            super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_578.
                                  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_578.
                                  super__Vector_base<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_std::allocator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_540.tti.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_540.tti.
                            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_540.tti.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_540.tti.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_540.tci.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_540.tci.
                            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_540.tci.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_540.tci.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_540.tvi.
              super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_540.tvi.
                            super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_540.tvi.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_540.tvi.
                                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_540.texcoords.
              super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_540.texcoords.
                            super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_540.texcoords.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_540.texcoords.
                                  super__Vector_base<Eigen::Matrix<float,_2,_1,_0,_2,_1>,_std::allocator<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_540.colors.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_540.colors.
                            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_540.colors.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_540.colors.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if ((_Optional_payload_base<int>)
              local_540.vertices.
              super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (_Optional_payload_base<int>)0x0) {
            operator_delete(local_540.vertices.
                            super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_540.vertices.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_540.vertices.
                                  super__Vector_base<Eigen::Matrix<float,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          free(local_5c8.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          free(local_598.super_PlainObjectBase<Eigen::Matrix<float,__1,_1,_0,__1,_1>_>.m_storage.
               m_data);
          return local_448;
        }
      }
    }
  }
  __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/CwiseBinaryOp.h"
                ,0x74,
                "Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<float>, const Eigen::Matrix<float, -1, 1>, const Eigen::Matrix<float, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_sum_op<float>, Lhs = const Eigen::Matrix<float, -1, 1>, Rhs = const Eigen::Matrix<float, -1, 1>]"
               );
}

Assistant:

inline std::pair<core::Mesh, fitting::RenderingParameters> fit_shape_and_pose(
    const morphablemodel::MorphableModel& morphable_model,
    const core::LandmarkCollection<Eigen::Vector2f>& landmarks, const core::LandmarkMapper& landmark_mapper,
    int image_width, int image_height, const morphablemodel::EdgeTopology& edge_topology,
    const fitting::ContourLandmarks& contour_landmarks, const fitting::ModelContour& model_contour,
    int num_iterations, cpp17::optional<int> num_shape_coefficients_to_fit, float lambda_identity,
    cpp17::optional<int> num_expression_coefficients_to_fit, cpp17::optional<float> lambda_expressions,
    std::vector<float>& pca_shape_coefficients, std::vector<float>& expression_coefficients,
    std::vector<Eigen::Vector2f>& fitted_image_points)
{
    // assert(blendshapes.size() > 0);
    assert(landmarks.size() >= 4);
    assert(image_width > 0 && image_height > 0);
    assert(num_iterations > 0); // Can we allow 0, for only the initial pose-fit?
    assert(pca_shape_coefficients.size() <= morphable_model.get_shape_model().get_num_principal_components());
    // More asserts I forgot?
    if (num_shape_coefficients_to_fit)
    {
        if (num_shape_coefficients_to_fit.value() >
            morphable_model.get_shape_model().get_num_principal_components())
        {
            throw std::runtime_error(
                "Specified more shape coefficients to fit than the given shape model contains.");
        }
    }

    using Eigen::MatrixXf;
    using Eigen::Vector2f;
    using Eigen::Vector4f;
    using Eigen::VectorXf;
    using std::vector;

    if (!num_shape_coefficients_to_fit)
    {
        num_shape_coefficients_to_fit = morphable_model.get_shape_model().get_num_principal_components();
    }

    if (pca_shape_coefficients.empty())
    {
        pca_shape_coefficients.resize(num_shape_coefficients_to_fit.value());
    }
    // Todo: This leaves the following case open: num_coeffs given is empty or defined, but the
    // pca_shape_coefficients given is != num_coeffs or the model's max-coeffs. What to do then? Handle & document!

    /*if (expression_coefficients.empty())
    {
        expression_coefficients.resize(blendshapes.size());
    }*/

    // Current mesh - either from the given coefficients, or the mean:
    VectorXf current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
    assert(morphable_model.has_separate_expression_model()); // Note: We could also just skip the expression fitting in this case.
    // Note we don't check whether the shape and expression model dimensions match.
    // Note: We're calling this in a loop, and morphablemodel::to_matrix(expression_blendshapes) now gets
    // called again in every fitting iteration.
    VectorXf current_combined_shape =
        current_pca_shape +
        draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
    auto current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The 2D and 3D point correspondences used for the fitting:
    vector<Vector4f> model_points; // the points in the 3D shape model
    vector<int> vertex_indices; // their vertex indices
    vector<Vector2f> image_points; // the corresponding 2D landmark points

    // Sub-select all the landmarks which we have a mapping for (i.e. that are defined in the 3DMM),
    // and get the corresponding model points (mean if given no initial coeffs, from the computed shape otherwise):
    for (int i = 0; i < landmarks.size(); ++i)
    {
        const cpp17::optional<int> vertex_idx = core::get_vertex_index(
            landmarks[i].name, landmark_mapper, morphable_model.get_landmark_definitions());
        if (!vertex_idx) // vertex index not defined for the current landmark
        {
            continue;
        }
        model_points.emplace_back(current_mesh.vertices[vertex_idx.value()].homogeneous());
        vertex_indices.emplace_back(vertex_idx.value());
        image_points.emplace_back(landmarks[i].coordinates);
    }

    // Need to do an initial pose fit to do the contour fitting inside the loop.
    // We'll do an expression fit too, since face shapes vary quite a lot, depending on expressions.
    fitting::ScaledOrthoProjectionParameters current_pose =
        fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
    fitting::RenderingParameters rendering_params(current_pose, image_width, image_height);

    const Eigen::Matrix<float, 3, 4> affine_from_ortho =
        fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);
    expression_coefficients =
        fit_expressions(morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
                        image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

    // Mesh with same PCA coeffs as before, but new expression fit (this is relevant if no initial blendshape coeffs have been given):
    current_combined_shape = current_pca_shape + draw_sample(morphable_model.get_expression_model().value(),
                                                             expression_coefficients);
    current_mesh = morphablemodel::sample_to_mesh(
        current_combined_shape, morphable_model.get_color_model().get_mean(),
        morphable_model.get_shape_model().get_triangle_list(),
        morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
        morphable_model.get_texture_triangle_indices());

    // The static (fixed) landmark correspondences which will stay the same throughout
    // the fitting (the inner face landmarks):
    const auto fixed_image_points = image_points;
    const auto fixed_vertex_indices = vertex_indices;

    for (int i = 0; i < num_iterations; ++i)
    {
        image_points = fixed_image_points;
        vertex_indices = fixed_vertex_indices;
        // Given the current pose, find 2D-3D contour correspondences of the front-facing face contour:
        vector<Vector2f> image_points_contour;
        vector<int> vertex_indices_contour;
        const auto yaw_angle = rendering_params.get_yaw_pitch_roll()[0];
        // For each 2D contour landmark, get the corresponding 3D vertex point and vertex id:
        std::tie(image_points_contour, std::ignore, vertex_indices_contour) =
            fitting::get_contour_correspondences(landmarks, contour_landmarks, model_contour, yaw_angle,
                                                 current_mesh, rendering_params.get_modelview(),
                                                 rendering_params.get_projection(),
                                                 fitting::get_opencv_viewport(image_width, image_height));
        // Add the contour correspondences to the set of landmarks that we use for the fitting:
        vertex_indices = fitting::concat(vertex_indices, vertex_indices_contour);
        image_points = fitting::concat(image_points, image_points_contour);

        // Fit the occluding (away-facing) contour using the detected contour LMs:
        vector<Vector2f> occluding_contour_landmarks;
        if (yaw_angle >= 0.0f) // positive yaw = subject looking to the left
        { // the left contour is the occluding one we want to use ("away-facing")
            const auto contour_landmarks_ =
                core::filter(landmarks, contour_landmarks.left_contour); // Can do this outside of the loop
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        } else
        {
            const auto contour_landmarks_ = core::filter(landmarks, contour_landmarks.right_contour);
            std::for_each(begin(contour_landmarks_), end(contour_landmarks_),
                          [&occluding_contour_landmarks](const auto& lm) {
                              occluding_contour_landmarks.push_back({lm.coordinates[0], lm.coordinates[1]});
                          });
        }
        const auto edge_correspondences = fitting::find_occluding_edge_correspondences(
            current_mesh, edge_topology, rendering_params, occluding_contour_landmarks, 180.0f);
        image_points = fitting::concat(image_points, edge_correspondences.first);
        vertex_indices = fitting::concat(vertex_indices, edge_correspondences.second);

        // Get the model points of the current mesh, for all correspondences that we've got:
        model_points.clear();
        for (auto v : vertex_indices)
        {
            model_points.push_back({current_mesh.vertices[v][0], current_mesh.vertices[v][1],
                                    current_mesh.vertices[v][2], 1.0f});
        }

        // Re-estimate the pose, using all correspondences:
        current_pose =
            fitting::estimate_orthographic_projection_linear(image_points, model_points, true, image_height);
        rendering_params = fitting::RenderingParameters(current_pose, image_width, image_height);

        const Eigen::Matrix<float, 3, 4> affine_from_ortho =
            fitting::get_3x4_affine_camera_matrix(rendering_params, image_width, image_height);

        // Estimate the PCA shape coefficients with the current blendshape coefficients:
        const VectorXf mean_plus_expressions =
            morphable_model.get_shape_model().get_mean() +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        pca_shape_coefficients = fitting::fit_shape_to_landmarks_linear(
            morphable_model.get_shape_model(), affine_from_ortho, image_points, vertex_indices,
            mean_plus_expressions, lambda_identity, num_shape_coefficients_to_fit);

        // Estimate the blendshape coefficients with the current PCA model estimate:
        current_pca_shape = morphable_model.get_shape_model().draw_sample(pca_shape_coefficients);
        expression_coefficients = fit_expressions(
            morphable_model.get_expression_model().value(), current_pca_shape, affine_from_ortho,
            image_points, vertex_indices, lambda_expressions, num_expression_coefficients_to_fit);

        current_combined_shape =
            current_pca_shape +
            draw_sample(morphable_model.get_expression_model().value(), expression_coefficients);
        current_mesh = morphablemodel::sample_to_mesh(
            current_combined_shape, morphable_model.get_color_model().get_mean(),
            morphable_model.get_shape_model().get_triangle_list(),
            morphable_model.get_color_model().get_triangle_list(), morphable_model.get_texture_coordinates(),
            morphable_model.get_texture_triangle_indices());
    }

    fitted_image_points = image_points;
    return {current_mesh, rendering_params}; // I think we could also work with a VectorXf face_instance in
                                             // this function instead of a Mesh, but it would convolute the
                                             // code more (i.e. more complicated to access vertices).
}